

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O1

void HTS_Engine_save_riff(HTS_Engine *engine,FILE *fp)

{
  HTS_GStreamSet *gss;
  size_t sVar1;
  size_t sVar2;
  double dVar3;
  short temp;
  short data_35_36;
  short data_33_34;
  short data_23_24;
  short data_21_22;
  int data_41_44;
  int data_29_32;
  int data_25_28;
  int data_17_20;
  char data_13_16 [4];
  char data_37_40 [4];
  char data_09_12 [4];
  int data_05_08;
  char data_01_04 [4];
  undefined2 local_5e;
  undefined2 local_5c;
  undefined2 local_5a;
  undefined2 local_58;
  undefined2 local_56;
  int local_54;
  int local_50;
  int local_4c [6];
  undefined4 local_34;
  
  gss = &engine->gss;
  local_34 = 0x46464952;
  sVar1 = HTS_GStreamSet_get_total_nsamples(gss);
  local_4c[5] = (int)sVar1 * 2 + 0x24;
  local_4c[4] = 0x45564157;
  local_4c[2] = 0x20746d66;
  local_4c[1] = 0x10;
  local_56 = 1;
  local_58 = 1;
  local_4c[0] = (int)(engine->condition).sampling_frequency;
  local_50 = local_4c[0] * 2;
  local_5a = 2;
  local_5c = 0x10;
  local_4c[3] = 0x61746164;
  sVar1 = HTS_GStreamSet_get_total_nsamples(gss);
  local_54 = (int)sVar1 * 2;
  HTS_fwrite_little_endian(&local_34,1,4,fp);
  HTS_fwrite_little_endian(local_4c + 5,4,1,fp);
  HTS_fwrite_little_endian(local_4c + 4,1,4,fp);
  HTS_fwrite_little_endian(local_4c + 2,1,4,fp);
  HTS_fwrite_little_endian(local_4c + 1,4,1,fp);
  HTS_fwrite_little_endian(&local_56,2,1,fp);
  HTS_fwrite_little_endian(&local_58,2,1,fp);
  HTS_fwrite_little_endian(local_4c,4,1,fp);
  HTS_fwrite_little_endian(&local_50,4,1,fp);
  HTS_fwrite_little_endian(&local_5a,2,1,fp);
  HTS_fwrite_little_endian(&local_5c,2,1,fp);
  HTS_fwrite_little_endian(local_4c + 3,1,4,fp);
  HTS_fwrite_little_endian(&local_54,4,1,fp);
  sVar1 = HTS_GStreamSet_get_total_nsamples(gss);
  if (sVar1 != 0) {
    sVar1 = 0;
    do {
      dVar3 = HTS_GStreamSet_get_speech(gss,sVar1);
      if (dVar3 <= 32767.0) {
        if (-32768.0 <= dVar3) {
          local_5e = (undefined2)(int)dVar3;
        }
        else {
          local_5e = 0x8000;
        }
      }
      else {
        local_5e = 0x7fff;
      }
      HTS_fwrite_little_endian(&local_5e,2,1,fp);
      sVar1 = sVar1 + 1;
      sVar2 = HTS_GStreamSet_get_total_nsamples(gss);
    } while (sVar1 < sVar2);
  }
  return;
}

Assistant:

void HTS_Engine_save_riff(HTS_Engine * engine, FILE * fp)
{
   size_t i;
   double x;
   short temp;

   HTS_GStreamSet *gss = &engine->gss;
   char data_01_04[] = { 'R', 'I', 'F', 'F' };
   int data_05_08 = HTS_GStreamSet_get_total_nsamples(gss) * sizeof(short) + 36;
   char data_09_12[] = { 'W', 'A', 'V', 'E' };
   char data_13_16[] = { 'f', 'm', 't', ' ' };
   int data_17_20 = 16;
   short data_21_22 = 1;        /* PCM */
   short data_23_24 = 1;        /* monoral */
   int data_25_28 = engine->condition.sampling_frequency;
   int data_29_32 = engine->condition.sampling_frequency * sizeof(short);
   short data_33_34 = sizeof(short);
   short data_35_36 = (short) (sizeof(short) * 8);
   char data_37_40[] = { 'd', 'a', 't', 'a' };
   int data_41_44 = HTS_GStreamSet_get_total_nsamples(gss) * sizeof(short);

   /* write header */
   HTS_fwrite_little_endian(data_01_04, sizeof(char), 4, fp);
   HTS_fwrite_little_endian(&data_05_08, sizeof(int), 1, fp);
   HTS_fwrite_little_endian(data_09_12, sizeof(char), 4, fp);
   HTS_fwrite_little_endian(data_13_16, sizeof(char), 4, fp);
   HTS_fwrite_little_endian(&data_17_20, sizeof(int), 1, fp);
   HTS_fwrite_little_endian(&data_21_22, sizeof(short), 1, fp);
   HTS_fwrite_little_endian(&data_23_24, sizeof(short), 1, fp);
   HTS_fwrite_little_endian(&data_25_28, sizeof(int), 1, fp);
   HTS_fwrite_little_endian(&data_29_32, sizeof(int), 1, fp);
   HTS_fwrite_little_endian(&data_33_34, sizeof(short), 1, fp);
   HTS_fwrite_little_endian(&data_35_36, sizeof(short), 1, fp);
   HTS_fwrite_little_endian(data_37_40, sizeof(char), 4, fp);
   HTS_fwrite_little_endian(&data_41_44, sizeof(int), 1, fp);
   /* write data */
   for (i = 0; i < HTS_GStreamSet_get_total_nsamples(gss); i++) {
      x = HTS_GStreamSet_get_speech(gss, i);
      if (x > 32767.0)
         temp = 32767;
      else if (x < -32768.0)
         temp = -32768;
      else
         temp = (short) x;
      HTS_fwrite_little_endian(&temp, sizeof(short), 1, fp);
   }
}